

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_separator(nk_context *ctx,char *items_separated_by_separator,int separator,int selected
                      ,int count,int item_height,nk_vec2 size)

{
  undefined8 uVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar3;
  undefined8 in_XMM0_Qa;
  nk_vec2 nVar4;
  int length;
  char *iter;
  char *current_item;
  nk_vec2 window_padding;
  nk_vec2 item_spacing;
  int max_height;
  int i;
  int in_stack_000000c4;
  char *in_stack_000000c8;
  nk_context *in_stack_000000d0;
  nk_vec2 in_stack_000000dc;
  ushort in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  nk_context *ctx_00;
  char *local_58;
  char *local_50;
  float fStack_44;
  float fStack_3c;
  int local_34;
  int local_28;
  undefined8 local_c;
  int local_4;
  
  local_4 = in_ECX;
  if ((in_RDI != 0) && (in_RSI != (char *)0x0)) {
    uVar1 = *(undefined8 *)(in_RDI + 0x1e70);
    nVar4 = nk_panel_get_padding
                      ((nk_style *)(in_RDI + 0x150),
                       **(nk_panel_type **)(*(long *)(in_RDI + 0x3fc8) + 0xa0));
    fStack_3c = (float)((ulong)uVar1 >> 0x20);
    fStack_44 = nVar4.y;
    iVar2 = (int)fStack_3c * 2 + (int)fStack_44 * 2 + in_R8D * in_R9D + in_R8D * (int)fStack_3c;
    local_c._4_4_ = (float)((ulong)in_XMM0_Qa >> 0x20);
    if ((float)iVar2 <= local_c._4_4_) {
      local_c._4_4_ = (float)iVar2;
    }
    local_c._0_4_ = (undefined4)in_XMM0_Qa;
    local_50 = in_RSI;
    for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
      local_58 = local_50;
      while( true ) {
        bVar3 = false;
        if (*local_58 != '\0') {
          bVar3 = *local_58 != in_EDX;
        }
        if (!bVar3) break;
        local_58 = local_58 + 1;
      }
      in_stack_ffffffffffffff8b = 0;
      if (local_34 == in_ECX) break;
      local_50 = local_58 + 1;
    }
    ctx_00 = local_c;
    iVar2 = nk_combo_begin_text(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,
                                in_stack_000000dc);
    local_28 = in_ECX;
    if (iVar2 != 0) {
      nk_layout_row_dynamic
                (ctx_00,local_c._4_4_,
                 CONCAT13(in_stack_ffffffffffffff8b,
                          CONCAT12(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88)));
      local_50 = in_RSI;
      for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
        local_58 = local_50;
        while( true ) {
          bVar3 = false;
          if (*local_58 != '\0') {
            bVar3 = *local_58 != in_EDX;
          }
          if (!bVar3) break;
          local_58 = local_58 + 1;
        }
        iVar2 = nk_combo_item_text(ctx_00,(char *)CONCAT44(local_c._4_4_,
                                                           CONCAT13(in_stack_ffffffffffffff8b,
                                                                    (uint3)in_stack_ffffffffffffff88
                                                                   )),0,0x130860);
        if (iVar2 != 0) {
          local_28 = local_34;
        }
        local_50 = local_50 + (long)((int)local_58 - (int)local_50) + 1;
      }
      nk_combo_end((nk_context *)0x13089d);
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

NK_API int
nk_combo_separator(struct nk_context *ctx, const char *items_separated_by_separator,
    int separator, int selected, int count, int item_height, struct nk_vec2 size)
{
    int i;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;
    const char *current_item;
    const char *iter;
    int length = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(items_separated_by_separator);
    if (!ctx || !items_separated_by_separator)
        return selected;

    /* calculate popup window */
    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);

    /* find selected item */
    current_item = items_separated_by_separator;
    for (i = 0; i < count; ++i) {
        iter = current_item;
        while (*iter && *iter != separator) iter++;
        length = (int)(iter - current_item);
        if (i == selected) break;
        current_item = iter + 1;
    }

    if (nk_combo_begin_text(ctx, current_item, length, size)) {
        current_item = items_separated_by_separator;
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            iter = current_item;
            while (*iter && *iter != separator) iter++;
            length = (int)(iter - current_item);
            if (nk_combo_item_text(ctx, current_item, length, NK_TEXT_LEFT))
                selected = i;
            current_item = current_item + length + 1;
        }
        nk_combo_end(ctx);
    }
    return selected;
}